

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# out_of_source_main.cpp
# Opt level: O2

string * getApprovedFilesLocation_abi_cxx11_(void)

{
  bool bVar1;
  char *in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string locationFromEnvVar;
  allocator local_31;
  string local_30;
  
  ApprovalTests::SystemUtils::safeGetEnv_abi_cxx11_
            (&local_30,(SystemUtils *)"APPROVED_FILES_ROOT_DIR",in_RDX);
  if (local_30._M_string_length == 0) {
    bVar1 = isRunningInBuildEnvironment();
    if (bVar1) {
      std::__cxx11::string::string((string *)in_RDI,"{TestSourceDirectory}/",&local_31);
    }
    else {
      std::__cxx11::string::string((string *)in_RDI,"./{RelativeTestSourceDirectory}/",&local_31);
    }
  }
  else {
    std::operator+(in_RDI,&local_30,"/{RelativeTestSourceDirectory}/");
  }
  std::__cxx11::string::~string((string *)&local_30);
  return in_RDI;
}

Assistant:

std::string getApprovedFilesLocation()
{
    std::string locationFromEnvVar = SystemUtils::safeGetEnv("APPROVED_FILES_ROOT_DIR");
    if (!locationFromEnvVar.empty())
    {
        return locationFromEnvVar + "/{RelativeTestSourceDirectory}/";
    }

    if (isRunningInBuildEnvironment())
    {
        return "{TestSourceDirectory}/";
    }

    return "./{RelativeTestSourceDirectory}/"; // Use current working directory
}